

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktUniformBlockCase.cpp
# Opt level: O3

void vkt::ubo::anon_unknown_0::computeStd140Layout
               (UniformLayout *layout,int *curOffset,int curBlockNdx,string *curPrefix,VarType *type
               ,deUint32 layoutFlags)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  VarType *pVVar2;
  pointer pcVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  DataType DVar7;
  int iVar8;
  DataType dataType;
  undefined8 *puVar9;
  long *plVar10;
  size_type *psVar11;
  ulong *puVar12;
  uint uVar13;
  ulong uVar14;
  pointer pSVar15;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  UniformLayoutEntry entry;
  string local_250;
  UniformLayout *local_230;
  string *local_228;
  long *local_220;
  undefined8 local_218;
  long local_210;
  undefined8 uStack_208;
  VarType *local_200;
  ulong *local_1f8;
  long local_1f0;
  ulong local_1e8 [2];
  int local_1d4;
  int *local_1d0;
  ulong *local_1c8;
  long local_1c0;
  ulong local_1b8 [2];
  value_type local_1a8;
  ios_base local_138 [264];
  
  local_230 = layout;
  local_228 = curPrefix;
  iVar4 = computeStd140BaseAlignment(type);
  local_1d4 = iVar4 + -1;
  uVar5 = -iVar4;
  uVar13 = *curOffset + local_1d4 & uVar5;
  *curOffset = uVar13;
  if (type->m_type == TYPE_ARRAY) {
    pVVar2 = (type->m_data).array.elementType;
    if (pVVar2->m_type != TYPE_BASIC) {
      if ((type->m_data).array.size < 1) {
        return;
      }
      iVar4 = 0;
      do {
        local_1f8 = local_1e8;
        pcVar3 = (local_228->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1f8,pcVar3,pcVar3 + local_228->_M_string_length);
        std::__cxx11::string::append((char *)&local_1f8);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
        std::ostream::operator<<(&local_1a8,iVar4);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
        std::ios_base::~ios_base(local_138);
        uVar14 = 0xf;
        if (local_1f8 != local_1e8) {
          uVar14 = local_1e8[0];
        }
        if (uVar14 < (ulong)(local_1c0 + local_1f0)) {
          uVar14 = 0xf;
          if (local_1c8 != local_1b8) {
            uVar14 = local_1b8[0];
          }
          if (uVar14 < (ulong)(local_1c0 + local_1f0)) goto LAB_0067254d;
          puVar9 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_1c8,0,(char *)0x0,(ulong)local_1f8);
        }
        else {
LAB_0067254d:
          puVar9 = (undefined8 *)
                   std::__cxx11::string::_M_append((char *)&local_1f8,(ulong)local_1c8);
        }
        local_220 = &local_210;
        plVar10 = puVar9 + 2;
        if ((long *)*puVar9 == plVar10) {
          local_210 = *plVar10;
          uStack_208 = puVar9[3];
        }
        else {
          local_210 = *plVar10;
          local_220 = (long *)*puVar9;
        }
        local_218 = puVar9[1];
        *puVar9 = plVar10;
        puVar9[1] = 0;
        *(undefined1 *)plVar10 = 0;
        plVar10 = (long *)std::__cxx11::string::append((char *)&local_220);
        psVar11 = (size_type *)(plVar10 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar10 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar11) {
          local_250.field_2._M_allocated_capacity = *psVar11;
          local_250.field_2._8_8_ = plVar10[3];
          local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
        }
        else {
          local_250.field_2._M_allocated_capacity = *psVar11;
          local_250._M_dataplus._M_p = (pointer)*plVar10;
        }
        local_250._M_string_length = plVar10[1];
        *plVar10 = (long)psVar11;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        computeStd140Layout(local_230,curOffset,curBlockNdx,&local_250,
                            (type->m_data).array.elementType,layoutFlags);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_250._M_dataplus._M_p != &local_250.field_2) {
          operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
        }
        if (local_220 != &local_210) {
          operator_delete(local_220,local_210 + 1);
        }
        if (local_1c8 != local_1b8) {
          operator_delete(local_1c8,local_1b8[0] + 1);
        }
        if (local_1f8 != local_1e8) {
          operator_delete(local_1f8,local_1e8[0] + 1);
        }
        iVar4 = iVar4 + 1;
        if ((type->m_data).array.size <= iVar4) {
          return;
        }
      } while( true );
    }
    DVar7 = (pVVar2->m_data).basicType;
    local_1d0 = curOffset;
    if (DVar7 - TYPE_DOUBLE_MAT2 < 9 || DVar7 - TYPE_FLOAT_MAT2 < 9) {
      local_200 = type;
      if ((layoutFlags & 0x40) == 0) {
        iVar4 = glu::getDataTypeMatrixNumRows(DVar7);
        iVar6 = glu::getDataTypeMatrixNumColumns(DVar7);
      }
      else {
        iVar4 = glu::getDataTypeMatrixNumColumns(DVar7);
        iVar6 = glu::getDataTypeMatrixNumRows(DVar7);
      }
      dataType = glu::getDataTypeFloatVec(iVar4);
      iVar8 = glu::getDataTypeScalarSize(dataType);
      iVar4 = 0x10;
      if (0x10 < iVar8 * 4) {
        iVar4 = iVar8 * 4;
      }
      local_1a8.name._M_dataplus._M_p = (pointer)&local_1a8.name.field_2;
      local_1a8.name._M_string_length = 0;
      local_1a8.name.field_2._M_allocated_capacity =
           local_1a8.name.field_2._M_allocated_capacity & 0xffffffffffffff00;
      local_1a8.type = TYPE_LAST;
      local_1a8.size = 0;
      local_1a8.blockLayoutNdx = -1;
      local_1a8.offset = -1;
      local_1a8.arrayStride = -1;
      local_1a8.matrixStride = -1;
      local_1a8.isRowMajor = false;
      local_1a8.instanceNdx = 0;
      pcVar3 = (local_228->_M_dataplus)._M_p;
      local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_250,pcVar3,pcVar3 + local_228->_M_string_length);
      std::__cxx11::string::append((char *)&local_250);
      std::__cxx11::string::operator=((string *)&local_1a8,(string *)&local_250);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_250._M_dataplus._M_p != &local_250.field_2) {
        operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
      }
      local_1a8.offset = *local_1d0;
      local_1a8.size = (local_200->m_data).array.size;
      local_1a8.type = DVar7;
      local_1a8.matrixStride = iVar4;
      local_1a8.arrayStride = iVar6 * iVar4;
      local_1a8.isRowMajor = SUB41((layoutFlags & 0x40) >> 6,0);
      *local_1d0 = iVar6 * iVar4 * local_1a8.size + local_1a8.offset;
      local_1a8.blockLayoutNdx = curBlockNdx;
      std::vector<vkt::ubo::UniformLayoutEntry,_std::allocator<vkt::ubo::UniformLayoutEntry>_>::
      push_back(&local_230->uniforms,&local_1a8);
    }
    else {
      local_1a8.name._M_dataplus._M_p = (pointer)&local_1a8.name.field_2;
      local_1a8.name._M_string_length = 0;
      local_1a8.name.field_2._M_allocated_capacity =
           (ulong)(uint7)local_1a8.name.field_2._M_allocated_capacity._1_7_ << 8;
      local_1a8.type = TYPE_LAST;
      local_1a8.size = 0;
      local_1a8.blockLayoutNdx = -1;
      local_1a8.offset = -1;
      local_1a8.arrayStride = -1;
      local_1a8.matrixStride = -1;
      local_1a8.isRowMajor = false;
      local_1a8.instanceNdx = 0;
      iVar4 = glu::getDataTypeScalarSize(DVar7);
      uVar13 = 0x10;
      if (0x10 < iVar4 * 4) {
        uVar13 = iVar4 * 4;
      }
      pcVar3 = (local_228->_M_dataplus)._M_p;
      local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_250,pcVar3,pcVar3 + local_228->_M_string_length);
      std::__cxx11::string::append((char *)&local_250);
      std::__cxx11::string::operator=((string *)&local_1a8,(string *)&local_250);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_250._M_dataplus._M_p != &local_250.field_2) {
        operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
      }
      local_1a8.offset = *local_1d0;
      local_1a8.size = (type->m_data).array.size;
      local_1a8.type = DVar7;
      local_1a8.matrixStride = 0;
      local_1a8.arrayStride = uVar13;
      *local_1d0 = local_1a8.size * uVar13 + local_1a8.offset;
      local_1a8.blockLayoutNdx = curBlockNdx;
      std::vector<vkt::ubo::UniformLayoutEntry,_std::allocator<vkt::ubo::UniformLayoutEntry>_>::
      push_back(&local_230->uniforms,&local_1a8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8.name._M_dataplus._M_p == &local_1a8.name.field_2) {
      return;
    }
  }
  else {
    if (type->m_type != TYPE_BASIC) {
      pSVar15 = (((type->m_data).structPtr)->m_members).
                super__Vector_base<vkt::ubo::StructMember,_std::allocator<vkt::ubo::StructMember>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if (pSVar15 !=
          (((type->m_data).structPtr)->m_members).
          super__Vector_base<vkt::ubo::StructMember,_std::allocator<vkt::ubo::StructMember>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        paVar1 = &local_1a8.name.field_2;
        local_200 = (VarType *)(ulong)uVar5;
        do {
          pcVar3 = (local_228->_M_dataplus)._M_p;
          local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_250,pcVar3,pcVar3 + local_228->_M_string_length);
          std::__cxx11::string::append((char *)&local_250);
          plVar10 = (long *)std::__cxx11::string::_M_append
                                      ((char *)&local_250,(ulong)(pSVar15->m_name)._M_dataplus._M_p)
          ;
          puVar12 = (ulong *)(plVar10 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar10 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar12) {
            local_1a8.name.field_2._M_allocated_capacity = *puVar12;
            local_1a8.name.field_2._8_8_ = plVar10[3];
            local_1a8.name._M_dataplus._M_p = (pointer)paVar1;
          }
          else {
            local_1a8.name.field_2._M_allocated_capacity = *puVar12;
            local_1a8.name._M_dataplus._M_p = (pointer)*plVar10;
          }
          local_1a8.name._M_string_length = plVar10[1];
          *plVar10 = (long)puVar12;
          plVar10[1] = 0;
          *(undefined1 *)(plVar10 + 2) = 0;
          computeStd140Layout(local_230,curOffset,curBlockNdx,&local_1a8.name,&pSVar15->m_type,
                              layoutFlags);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a8.name._M_dataplus._M_p != paVar1) {
            operator_delete(local_1a8.name._M_dataplus._M_p,
                            local_1a8.name.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_250._M_dataplus._M_p != &local_250.field_2) {
            operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
          }
          pSVar15 = pSVar15 + 1;
        } while (pSVar15 !=
                 (((type->m_data).structPtr)->m_members).
                 super__Vector_base<vkt::ubo::StructMember,_std::allocator<vkt::ubo::StructMember>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
        uVar13 = *curOffset;
        uVar5 = (uint)local_200;
      }
      *curOffset = local_1d4 + uVar13 & uVar5;
      return;
    }
    DVar7 = (type->m_data).basicType;
    paVar1 = &local_1a8.name.field_2;
    local_1a8.name._M_string_length = 0;
    local_1a8.name.field_2._M_allocated_capacity =
         (ulong)(uint7)local_1a8.name.field_2._M_allocated_capacity._1_7_ << 8;
    local_1a8.type = TYPE_LAST;
    local_1a8.size = 0;
    local_1a8.blockLayoutNdx = -1;
    local_1a8.offset = -1;
    local_1a8.arrayStride = -1;
    local_1a8.matrixStride = -1;
    local_1a8.isRowMajor = false;
    local_1a8.instanceNdx = 0;
    local_1a8.name._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_assign((string *)&local_1a8);
    local_1a8.size = 1;
    local_1a8.type = DVar7;
    local_1a8.arrayStride = 0;
    local_1a8.matrixStride = 0;
    if (DVar7 - TYPE_FLOAT_MAT2 < 9 || DVar7 - TYPE_DOUBLE_MAT2 < 9) {
      if ((layoutFlags & 0x40) == 0) {
        local_1a8.blockLayoutNdx = curBlockNdx;
        iVar4 = glu::getDataTypeMatrixNumRows(DVar7);
        iVar6 = glu::getDataTypeMatrixNumColumns(DVar7);
      }
      else {
        local_1a8.blockLayoutNdx = curBlockNdx;
        iVar4 = glu::getDataTypeMatrixNumColumns(DVar7);
        iVar6 = glu::getDataTypeMatrixNumRows(DVar7);
      }
      DVar7 = glu::getDataTypeFloatVec(iVar4);
      iVar8 = glu::getDataTypeScalarSize(DVar7);
      iVar4 = 0x10;
      if (0x10 < iVar8 * 4) {
        iVar4 = iVar8 * 4;
      }
      local_1a8.offset = *curOffset;
      local_1a8.matrixStride = iVar4;
      local_1a8.isRowMajor = SUB41((layoutFlags & 0x40) >> 6,0);
      iVar4 = iVar4 * iVar6 + local_1a8.offset;
    }
    else {
      local_1a8.offset = *curOffset;
      local_1a8.blockLayoutNdx = curBlockNdx;
      iVar4 = glu::getDataTypeScalarSize(DVar7);
      iVar4 = iVar4 * 4 + *curOffset;
    }
    *curOffset = iVar4;
    std::vector<vkt::ubo::UniformLayoutEntry,_std::allocator<vkt::ubo::UniformLayoutEntry>_>::
    push_back(&local_230->uniforms,&local_1a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8.name._M_dataplus._M_p == paVar1) {
      return;
    }
  }
  operator_delete(local_1a8.name._M_dataplus._M_p,local_1a8.name.field_2._M_allocated_capacity + 1);
  return;
}

Assistant:

void computeStd140Layout (UniformLayout& layout, int& curOffset, int curBlockNdx, const std::string& curPrefix, const VarType& type, deUint32 layoutFlags)
{
	int baseAlignment = computeStd140BaseAlignment(type);

	curOffset = deAlign32(curOffset, baseAlignment);

	if (type.isBasicType())
	{
		glu::DataType		basicType	= type.getBasicType();
		UniformLayoutEntry	entry;

		entry.name			= curPrefix;
		entry.type			= basicType;
		entry.size			= 1;
		entry.arrayStride	= 0;
		entry.matrixStride	= 0;
		entry.blockLayoutNdx= curBlockNdx;

		if (glu::isDataTypeMatrix(basicType))
		{
			// Array of vectors as specified in rules 5 & 7.
			bool	isRowMajor	= !!(layoutFlags & LAYOUT_ROW_MAJOR);
			int		vecSize		= isRowMajor ? glu::getDataTypeMatrixNumColumns(basicType)
											 : glu::getDataTypeMatrixNumRows(basicType);
			int		numVecs		= isRowMajor ? glu::getDataTypeMatrixNumRows(basicType)
											 : glu::getDataTypeMatrixNumColumns(basicType);
			int		stride		= getDataTypeArrayStride(glu::getDataTypeFloatVec(vecSize));

			entry.offset		= curOffset;
			entry.matrixStride	= stride;
			entry.isRowMajor	= isRowMajor;

			curOffset += numVecs*stride;
		}
		else
		{
			// Scalar or vector.
			entry.offset = curOffset;

			curOffset += getDataTypeByteSize(basicType);
		}

		layout.uniforms.push_back(entry);
	}
	else if (type.isArrayType())
	{
		const VarType&	elemType	= type.getElementType();

		if (elemType.isBasicType() && !glu::isDataTypeMatrix(elemType.getBasicType()))
		{
			// Array of scalars or vectors.
			glu::DataType		elemBasicType	= elemType.getBasicType();
			UniformLayoutEntry	entry;
			int					stride			= getDataTypeArrayStride(elemBasicType);

			entry.name			= curPrefix + "[0]"; // Array uniforms are always postfixed with [0]
			entry.type			= elemBasicType;
			entry.blockLayoutNdx= curBlockNdx;
			entry.offset		= curOffset;
			entry.size			= type.getArraySize();
			entry.arrayStride	= stride;
			entry.matrixStride	= 0;

			curOffset += stride*type.getArraySize();

			layout.uniforms.push_back(entry);
		}
		else if (elemType.isBasicType() && glu::isDataTypeMatrix(elemType.getBasicType()))
		{
			// Array of matrices.
			glu::DataType		elemBasicType	= elemType.getBasicType();
			bool				isRowMajor		= !!(layoutFlags & LAYOUT_ROW_MAJOR);
			int					vecSize			= isRowMajor ? glu::getDataTypeMatrixNumColumns(elemBasicType)
															 : glu::getDataTypeMatrixNumRows(elemBasicType);
			int					numVecs			= isRowMajor ? glu::getDataTypeMatrixNumRows(elemBasicType)
															 : glu::getDataTypeMatrixNumColumns(elemBasicType);
			int					stride			= getDataTypeArrayStride(glu::getDataTypeFloatVec(vecSize));
			UniformLayoutEntry	entry;

			entry.name			= curPrefix + "[0]"; // Array uniforms are always postfixed with [0]
			entry.type			= elemBasicType;
			entry.blockLayoutNdx= curBlockNdx;
			entry.offset		= curOffset;
			entry.size			= type.getArraySize();
			entry.arrayStride	= stride*numVecs;
			entry.matrixStride	= stride;
			entry.isRowMajor	= isRowMajor;

			curOffset += numVecs*type.getArraySize()*stride;

			layout.uniforms.push_back(entry);
		}
		else
		{
			DE_ASSERT(elemType.isStructType() || elemType.isArrayType());

			for (int elemNdx = 0; elemNdx < type.getArraySize(); elemNdx++)
				computeStd140Layout(layout, curOffset, curBlockNdx, curPrefix + "[" + de::toString(elemNdx) + "]", type.getElementType(), layoutFlags);
		}
	}
	else
	{
		DE_ASSERT(type.isStructType());

		for (StructType::ConstIterator memberIter = type.getStruct().begin(); memberIter != type.getStruct().end(); memberIter++)
			computeStd140Layout(layout, curOffset, curBlockNdx, curPrefix + "." + memberIter->getName(), memberIter->getType(), layoutFlags);

		curOffset = deAlign32(curOffset, baseAlignment);
	}
}